

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

DIR * __thiscall pstore::romfs::romfs::opendir(romfs *this,char *__name)

{
  not_null<const_char_*> in_RDX;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_60;
  error_or<const_pstore::romfs::directory_*> local_40;
  anon_class_1_0_00000001 create_descriptor;
  char *pcStack_20;
  anon_class_1_0_00000001 get_directory;
  romfs *this_local;
  not_null<const_char_*> path_local;
  
  pcStack_20 = __name;
  parse_path(&local_60,(romfs *)__name,in_RDX);
  pstore::operator>>=(&local_40,&local_60);
  pstore::operator>>=(this,&local_40);
  error_or<const_pstore::romfs::directory_*>::~error_or(&local_40);
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::~error_or(&local_60);
  return (DIR *)this;
}

Assistant:

error_or<dirent_descriptor> romfs::opendir (not_null<czstring> const path) {
            auto get_directory = [] (dirent const * const de) {
                using rett = error_or<directory const *>;
                return de->is_directory () ? rett{de->opendir ()}
                                           : rett{make_error_code (error_code::enotdir)};
            };

            auto create_descriptor = [] (directory const * const d) {
                auto const directory = std::make_shared<open_directory> (*d);
                return error_or<dirent_descriptor>{dirent_descriptor{directory}};
            };

            return (this->parse_path (path) >>= get_directory) >>= create_descriptor;
        }